

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O2

void __thiscall Array3dTest_ValueType_Test::TestBody(Array3dTest_ValueType_Test *this)

{
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  String local_30;
  AssertionResult gtest_ar_;
  
  gtest_ar_.success_ =
       std::type_info::operator==((type_info *)&double::typeinfo,(type_info *)&double::typeinfo);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_30,&gtest_ar_,
               "typeid(Array3d<double>::ValueType) == typeid(double)","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/ArrayTests.cpp"
               ,0x6d,local_30.c_str_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::String::~String(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(Array3dTest, ValueType)
{
    ASSERT_TRUE(typeid(Array3d<double>::ValueType) == typeid(double));
}